

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O1

bool __thiscall Box::intersect(Box *this,Ray *r,double *t)

{
  double *pdVar1;
  _func_int **pp_Var2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  BoxTestCount = BoxTestCount + 1;
  dVar9 = INFINITY;
  dVar8 = -INFINITY;
  lVar4 = 0x22;
  lVar5 = 0;
  do {
    dVar11 = *(double *)((long)this + lVar4 * 8 + -0x10);
    dVar12 = *(double *)((long)this + lVar4 * 8 + -8);
    pp_Var2 = (&(this->super_GeometricObject)._vptr_GeometricObject)[lVar4];
    dVar10 = (r->dir).z * (double)pp_Var2 + (r->dir).x * dVar11 + (r->dir).y * dVar12;
    dVar11 = (double)pp_Var2 * (r->org).z + dVar11 * (r->org).x + dVar12 * (r->org).y;
    if (dVar10 <= 0.01) {
      if (dVar10 < -0.01) {
        lVar6 = 0x160;
        lVar7 = 0x148;
        goto LAB_00105c90;
      }
      if ((dVar11 < *(double *)((long)this->d1 + lVar5)) ||
         (pdVar1 = (double *)((long)this->d2 + lVar5), *pdVar1 <= dVar11 && dVar11 != *pdVar1))
      goto LAB_00105d1b;
    }
    else {
      lVar6 = 0x148;
      lVar7 = 0x160;
LAB_00105c90:
      dVar12 = -(dVar11 + *(double *)
                           ((long)&(this->super_GeometricObject)._vptr_GeometricObject +
                           lVar5 + lVar6)) / dVar10;
      if ((dVar12 < dVar9) && (dVar9 = dVar12, dVar12 < geom_threshold)) goto LAB_00105d1b;
      dVar10 = -(*(double *)
                  ((long)&(this->super_GeometricObject)._vptr_GeometricObject + lVar5 + lVar7) +
                dVar11) / dVar10;
      if (dVar10 <= dVar8) {
        dVar10 = dVar8;
      }
      dVar8 = dVar10;
      if (dVar9 < dVar8) goto LAB_00105d1b;
    }
    lVar5 = lVar5 + 8;
    lVar4 = lVar4 + 3;
  } while (lVar5 != 0x18);
  *t = dVar8;
  bVar3 = true;
  if (dVar8 <= geom_threshold) {
LAB_00105d1b:
    BoxTestMisses = BoxTestMisses + 1;
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Box::intersect(Ray& r, double& t)
{
    STAT(BoxTestCount++);

    double tNear = -INFINITY;
    double tFar  = INFINITY;
    double t1,t2;
    double vd,vo;
    int i;

    for( i = 0; i < 3; i++ )
    {
        vd = r.dir & n[i];
        vo = r.org & n[i];

        if( vd > EPS )
        {
            t1 = -(vo + d2[i]) / vd;
            t2 = -(vo + d1[i]) / vd;
        }
        else
        if(vd < -EPS)
        {
            t1 = -(vo + d1[i]) / vd;
            t2 = -(vo + d2[i]) / vd;
        }
        else // ray is parallel to slab
        {
            if( vo < d1[i] || vo > d2[i] )
            {
                STAT(BoxTestMisses++);
                return false;
            }
            else
                continue;
        }
        if( t1 > tNear )
            tNear = t1;
        if( t2 < tFar )
            if( (tFar = t2) < geom_threshold )
            {
                STAT(BoxTestMisses++);
                return false;
            }
        if( tNear > tFar )
        {
            STAT(BoxTestMisses++);
            return false;
        }
    }
    t = tNear;
    if( t > geom_threshold )
        return true;
    else
    {
        STAT(BoxTestMisses++);
        return false;
    }
}